

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::PReLU_x86_avx2::forward_inplace(PReLU_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 *puVar3;
  long lVar4;
  _func_int **pp_Var5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  float *slope;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint _c;
  undefined1 (*pauVar13) [32];
  undefined1 (*pauVar14) [16];
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  Mat local_78;
  
  iVar6 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar6 == 3) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w;
      uVar12 = 0;
      uVar8 = (ulong)uVar15;
      if ((int)uVar15 < 1) {
        uVar8 = uVar12;
      }
      uVar10 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar10 = uVar12;
      }
      for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        Mat::channel(&local_78,bottom_top_blob,(int)uVar12);
        pauVar13 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx2[-3]) < 2) {
          uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]);
          auVar16._4_4_ = uVar2;
          auVar16._0_4_ = uVar2;
          auVar16._8_4_ = uVar2;
          auVar16._12_4_ = uVar2;
        }
        else {
          auVar16 = *(undefined1 (*) [16])
                     (*(undefined4 **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]) +
                     uVar12 * 4);
        }
        uVar9 = uVar8;
        while (iVar6 = (int)uVar9, uVar9 = (ulong)(iVar6 - 1), iVar6 != 0) {
          auVar21 = vmaxps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0) << 0x40);
          auVar17 = vminps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0) << 0x40);
          auVar21 = vfmadd213ps_fma(auVar17,auVar16,auVar21);
          *(undefined1 (*) [16])*pauVar13 = auVar21;
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
        }
      }
    }
    else if (iVar6 == 2) {
      pp_Var5 = this->_vptr_PReLU_x86_avx2;
      uVar12 = 0;
      uVar8 = (ulong)(uint)bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        uVar8 = uVar12;
      }
      uVar10 = (ulong)(uint)bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar10 = uVar12;
      }
      for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) < 2) {
          uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]);
          auVar21._4_4_ = uVar2;
          auVar21._0_4_ = uVar2;
          auVar21._8_4_ = uVar2;
          auVar21._12_4_ = uVar2;
        }
        else {
          auVar21 = *(undefined1 (*) [16])
                     (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]) + uVar12 * 4);
        }
        pauVar14 = (undefined1 (*) [16])
                   ((long)bottom_top_blob->w * uVar12 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar9 = uVar8;
        while (iVar6 = (int)uVar9, uVar9 = (ulong)(iVar6 - 1), iVar6 != 0) {
          auVar16 = vmaxps_avx(*pauVar14,ZEXT816(0));
          auVar17 = vminps_avx(*pauVar14,ZEXT816(0));
          auVar16 = vfmadd213ps_fma(auVar17,auVar21,auVar16);
          *pauVar14 = auVar16;
          pauVar14 = pauVar14 + 1;
        }
      }
    }
    else if (iVar6 == 1) {
      uVar15 = bottom_top_blob->w;
      puVar3 = *(undefined4 **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx2[-3]) < 2) {
        uVar2 = *puVar3;
        auVar17._4_4_ = uVar2;
        auVar17._0_4_ = uVar2;
        auVar17._8_4_ = uVar2;
        auVar17._12_4_ = uVar2;
        uVar12 = 0;
        uVar8 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar8 = uVar12;
        }
        for (; uVar8 * 0x10 != uVar12; uVar12 = uVar12 + 0x10) {
          auVar16 = *(undefined1 (*) [16])((long)bottom_top_blob->data + uVar12);
          auVar21 = vmaxps_avx(auVar16,ZEXT816(0));
          auVar16 = vminps_avx(auVar16,ZEXT816(0));
          auVar16 = vfmadd213ps_fma(auVar16,auVar17,auVar21);
          *(undefined1 (*) [16])((long)bottom_top_blob->data + uVar12) = auVar16;
        }
      }
      else {
        uVar12 = 0;
        uVar8 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar8 = uVar12;
        }
        for (; uVar8 * 0x10 != uVar12; uVar12 = uVar12 + 0x10) {
          auVar16 = *(undefined1 (*) [16])((long)bottom_top_blob->data + uVar12);
          auVar21 = vmaxps_avx(auVar16,ZEXT816(0));
          auVar16 = vminps_avx(auVar16,ZEXT816(0));
          auVar16 = vfmadd132ps_fma(auVar16,auVar21,*(undefined1 (*) [16])((long)puVar3 + uVar12));
          *(undefined1 (*) [16])((long)bottom_top_blob->data + uVar12) = auVar16;
        }
      }
    }
  }
  else if (bottom_top_blob->elempack == 8) {
    if (iVar6 == 3) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w;
      uVar12 = 0;
      uVar8 = (ulong)uVar15;
      if ((int)uVar15 < 1) {
        uVar8 = uVar12;
      }
      uVar10 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar10 = uVar12;
      }
      for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        Mat::channel(&local_78,bottom_top_blob,(int)uVar12);
        pauVar13 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx2[-3]) < 2) {
          uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]);
          auVar19._4_4_ = uVar2;
          auVar19._0_4_ = uVar2;
          auVar19._8_4_ = uVar2;
          auVar19._12_4_ = uVar2;
          auVar19._16_4_ = uVar2;
          auVar19._20_4_ = uVar2;
          auVar19._24_4_ = uVar2;
          auVar19._28_4_ = uVar2;
        }
        else {
          auVar19 = *(undefined1 (*) [32])
                     (*(undefined4 **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]) +
                     uVar12 * 8);
        }
        uVar9 = uVar8;
        while (iVar6 = (int)uVar9, uVar9 = (ulong)(iVar6 - 1), iVar6 != 0) {
          auVar18 = vmaxps_avx(*pauVar13,ZEXT1632(ZEXT816(0) << 0x40));
          auVar22 = vminps_avx(*pauVar13,ZEXT1632(ZEXT816(0) << 0x40));
          auVar16 = vfmadd213ps_fma(auVar22,auVar19,auVar18);
          *pauVar13 = ZEXT1632(auVar16);
          pauVar13 = pauVar13 + 1;
        }
      }
    }
    else if (iVar6 == 2) {
      pp_Var5 = this->_vptr_PReLU_x86_avx2;
      uVar12 = 0;
      uVar8 = (ulong)(uint)bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        uVar8 = uVar12;
      }
      uVar10 = (ulong)(uint)bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar10 = uVar12;
      }
      for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) < 2) {
          uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]);
          auVar22._4_4_ = uVar2;
          auVar22._0_4_ = uVar2;
          auVar22._8_4_ = uVar2;
          auVar22._12_4_ = uVar2;
          auVar22._16_4_ = uVar2;
          auVar22._20_4_ = uVar2;
          auVar22._24_4_ = uVar2;
          auVar22._28_4_ = uVar2;
        }
        else {
          auVar22 = *(undefined1 (*) [32])
                     (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]) + uVar12 * 8);
        }
        pauVar13 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar12 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar9 = uVar8;
        while (iVar6 = (int)uVar9, uVar9 = (ulong)(iVar6 - 1), iVar6 != 0) {
          auVar18 = vmaxps_avx(*pauVar13,ZEXT832(0));
          auVar19 = vminps_avx(*pauVar13,ZEXT832(0));
          auVar16 = vfmadd213ps_fma(auVar19,auVar22,auVar18);
          *pauVar13 = ZEXT1632(auVar16);
          pauVar13 = pauVar13 + 1;
        }
      }
    }
    else if (iVar6 == 1) {
      uVar15 = bottom_top_blob->w;
      puVar3 = *(undefined4 **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx2[-3]) < 2) {
        uVar2 = *puVar3;
        auVar20._4_4_ = uVar2;
        auVar20._0_4_ = uVar2;
        auVar20._8_4_ = uVar2;
        auVar20._12_4_ = uVar2;
        auVar20._16_4_ = uVar2;
        auVar20._20_4_ = uVar2;
        auVar20._24_4_ = uVar2;
        auVar20._28_4_ = uVar2;
        uVar12 = 0;
        uVar8 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar8 = uVar12;
        }
        for (; uVar8 * 0x20 != uVar12; uVar12 = uVar12 + 0x20) {
          auVar18 = *(undefined1 (*) [32])((long)bottom_top_blob->data + uVar12);
          auVar19 = vmaxps_avx(auVar18,ZEXT832(0));
          auVar18 = vminps_avx(auVar18,ZEXT832(0));
          auVar16 = vfmadd213ps_fma(auVar18,auVar20,auVar19);
          *(undefined1 (*) [32])((long)bottom_top_blob->data + uVar12) = ZEXT1632(auVar16);
        }
      }
      else {
        uVar12 = 0;
        uVar8 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar8 = uVar12;
        }
        for (; uVar8 * 0x20 != uVar12; uVar12 = uVar12 + 0x20) {
          auVar18 = *(undefined1 (*) [32])((long)bottom_top_blob->data + uVar12);
          auVar19 = vmaxps_avx(auVar18,ZEXT832(0));
          auVar18 = vminps_avx(auVar18,ZEXT832(0));
          auVar16 = vfmadd132ps_fma(auVar18,auVar19,*(undefined1 (*) [32])((long)puVar3 + uVar12));
          *(undefined1 (*) [32])((long)bottom_top_blob->data + uVar12) = ZEXT1632(auVar16);
        }
      }
    }
  }
  else {
    if (iVar6 != 3) {
      iVar6 = PReLU::forward_inplace
                        ((PReLU *)((long)&this->_vptr_PReLU_x86_avx2 +
                                  (long)this->_vptr_PReLU_x86_avx2[-3]),bottom_top_blob,opt);
      return iVar6;
    }
    uVar15 = bottom_top_blob->c;
    uVar11 = bottom_top_blob->h * bottom_top_blob->w;
    _c = 0;
    if ((int)uVar15 < 1) {
      uVar15 = 0;
    }
    lVar4 = *(long *)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]);
    for (; _c != uVar15; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar13 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      uVar8 = 0;
      if (1 < *(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx2[-3])) {
        uVar8 = (ulong)_c;
      }
      fVar1 = *(float *)(lVar4 + uVar8 * 4);
      auVar18._4_4_ = fVar1;
      auVar18._0_4_ = fVar1;
      auVar18._8_4_ = fVar1;
      auVar18._12_4_ = fVar1;
      auVar18._16_4_ = fVar1;
      auVar18._20_4_ = fVar1;
      auVar18._24_4_ = fVar1;
      auVar18._28_4_ = fVar1;
      for (iVar6 = (int)uVar11 >> 3; uVar7 = uVar11 & 7, 0 < iVar6; iVar6 = iVar6 + -1) {
        auVar19 = vmaxps_avx(*pauVar13,ZEXT1632(ZEXT816(0) << 0x40));
        auVar22 = vminps_avx(*pauVar13,ZEXT1632(ZEXT816(0) << 0x40));
        auVar16 = vfmadd213ps_fma(auVar22,auVar18,auVar19);
        *pauVar13 = ZEXT1632(auVar16);
        pauVar13 = pauVar13 + 1;
      }
      for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        if (*(float *)*pauVar13 < 0.0) {
          *(float *)*pauVar13 = *(float *)*pauVar13 * fVar1;
        }
        pauVar13 = (undefined1 (*) [32])(*pauVar13 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _slope = _mm256_loadu_ps(slope + i * 8);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
            else
            {
                __m256 _slope = _mm256_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _slope = _mm_loadu_ps(slope + i * 4);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
            else
            {
                __m128 _slope = _mm_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return PReLU::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    const float* slope_data_ptr = slope_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        float slope = num_slope > 1 ? slope_data_ptr[q] : slope_data_ptr[0];

#if __AVX__
        int nn = size >> 3;
        int remain = size - (nn << 3);
#else
        int remain = size;
#endif // __AVX__

#if __AVX__
        for (; nn > 0; nn--)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, prelu_avx(_p, _mm256_set1_ps(slope)));
            ptr += 8;
        }
#endif // __AVX__
        for (; remain > 0; remain--)
        {
            if (*ptr < 0)
                *ptr *= slope;

            ptr++;
        }
    }

    return 0;
}